

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedBlending::VerifyImg
          (DrawBuffersIndexedBlending *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  ostringstream *this_00;
  bool bVar1;
  int y;
  int z;
  RGBA pixel;
  RGBA local_1d0;
  int local_1cc;
  DrawBuffersIndexedBlending *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [384];
  
  z = 0;
  local_1c8 = this;
  do {
    local_1cc = (textureLevel->m_size).m_data[1];
    if (local_1cc <= z) {
LAB_00cd0b41:
      return local_1cc <= z;
    }
    for (y = 0; y < (textureLevel->m_size).m_data[0]; y = y + 1) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1c0,(int)(ConstPixelBufferAccess *)local_1b0,y,z);
      tcu::RGBA::RGBA(&local_1d0,(Vec4 *)local_1c0);
      bVar1 = tcu::compareThreshold(local_1d0,expectedColor,epsilon);
      if (!bVar1) {
        local_1b0._0_8_ =
             ((local_1c8->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Expected value: ");
        tcu::operator<<((ostream *)this_00,expectedColor);
        std::operator<<((ostream *)this_00,"\n");
        std::operator<<((ostream *)this_00,"Read value:     ");
        tcu::operator<<((ostream *)this_00,local_1d0);
        std::operator<<((ostream *)this_00,"\n");
        std::operator<<((ostream *)this_00,"Epsilon:        ");
        tcu::operator<<((ostream *)this_00,epsilon);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00cd0b41;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

bool DrawBuffersIndexedBlending::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
										   tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::RGBA pixel(textureLevel.getAccess().getPixel(x, y));
			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}